

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  ScopePool *pSVar1;
  bool bVar2;
  List *__range1;
  ScopePool *pSVar3;
  bool bVar4;
  
  pSVar3 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pSVar3 == pSVar1;
  if (!bVar4) {
    bVar2 = ScopePool::IsAlreadyLocked(pSVar3,filename);
    while (!bVar2) {
      pSVar3 = pSVar3 + 1;
      bVar4 = pSVar3 == pSVar1;
      if (bVar4) goto LAB_003c22ae;
      bVar2 = ScopePool::IsAlreadyLocked(pSVar3,filename);
    }
    if (!bVar4) {
      return true;
    }
  }
LAB_003c22ae:
  pSVar3 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pSVar3 == pSVar1;
  if (!bVar4) {
    bVar2 = ScopePool::IsAlreadyLocked(pSVar3,filename);
    while (!bVar2) {
      pSVar3 = pSVar3 + 1;
      bVar4 = pSVar3 == pSVar1;
      if (bVar4) goto LAB_003c22f3;
      bVar2 = ScopePool::IsAlreadyLocked(pSVar3,filename);
    }
    if (!bVar4) {
      return true;
    }
  }
LAB_003c22f3:
  bVar4 = ScopePool::IsAlreadyLocked(&this->ProcessScope,filename);
  return bVar4;
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (auto const& funcScope : this->FunctionScopes) {
    const bool result = funcScope.IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (auto const& fileScope : this->FileScopes) {
    const bool result = fileScope.IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}